

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O2

void __thiscall pybind11::error_already_set::restore(error_already_set *this)

{
  PyObject *pPVar1;
  PyObject *pPVar2;
  PyObject *pPVar3;
  
  pPVar1 = (this->m_type).super_handle.m_ptr;
  pPVar2 = (this->m_value).super_handle.m_ptr;
  (this->m_type).super_handle.m_ptr = (PyObject *)0x0;
  (this->m_value).super_handle.m_ptr = (PyObject *)0x0;
  pPVar3 = (this->m_trace).super_handle.m_ptr;
  (this->m_trace).super_handle.m_ptr = (PyObject *)0x0;
  PyErr_Restore(pPVar1,pPVar2,pPVar3);
  return;
}

Assistant:

void restore() { PyErr_Restore(m_type.release().ptr(), m_value.release().ptr(), m_trace.release().ptr()); }